

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.hpp
# Opt level: O2

void __thiscall jsoncons::binary_stream_sink::push_back(binary_stream_sink *this,uint8_t ch)

{
  uint8_t *puVar1;
  
  puVar1 = this->p_;
  while (this->end_buffer_ <= puVar1) {
    std::ostream::write((char *)this->stream_ptr_,(long)this->begin_buffer_);
    puVar1 = this->begin_buffer_;
    this->p_ = puVar1;
  }
  this->p_ = puVar1 + 1;
  *puVar1 = ch;
  return;
}

Assistant:

void push_back(uint8_t ch)
        {
            if (p_ < end_buffer_)
            {
                *p_++ = ch;
            }
            else
            {
                stream_ptr_->write((char*)begin_buffer_, buffer_length());
                p_ = begin_buffer_;
                push_back(ch);
            }
        }